

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

void __thiscall xLearn::OndiskReader::Reset(OndiskReader *this)

{
  int iVar1;
  ostream *poVar2;
  Logger local_5c;
  string local_58;
  string local_38;
  
  iVar1 = fseek((FILE *)this->file_ptr_,0,0);
  if (iVar1 != 0) {
    local_5c.severity_ = FATAL;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader.cc"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Reset","");
    poVar2 = Logger::Start(FATAL,&local_38,0x13d,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Fail to return to the head of file.",0x23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    Logger::~Logger(&local_5c);
  }
  return;
}

Assistant:

void OndiskReader::Reset() {
  int ret = fseek(file_ptr_, 0, SEEK_SET);
  if (ret != 0) {
    LOG(FATAL) << "Fail to return to the head of file.";
  }
}